

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vl53l0x.cpp
# Opt level: O3

bool __thiscall VL53L0X::setMeasurementTimingBudget(VL53L0X *this,uint32_t budgetMicroseconds)

{
  bool bVar1;
  byte bVar2;
  byte bVar3;
  short sVar4;
  int iVar5;
  uint uVar6;
  uint16_t value;
  ushort uVar7;
  int iVar9;
  uint uVar10;
  bool bVar11;
  VL53L0XSequenceStepEnables enables;
  VL53L0XSequenceStepTimeouts timeouts;
  VL53L0XSequenceStepEnables local_4d;
  VL53L0XSequenceStepTimeouts local_48;
  uint16_t uVar8;
  
  if (budgetMicroseconds < 20000) {
    bVar11 = false;
  }
  else {
    bVar2 = readRegister(this,'\x01');
    bVar11 = (bool)(bVar2 >> 4 & 1);
    local_4d.dss = (bool)(bVar2 >> 3 & 1);
    local_4d.msrc = (bool)(bVar2 >> 2 & 1);
    bVar3 = bVar2 >> 6;
    local_4d.preRange = (bool)(bVar3 & 1);
    local_4d.finalRange = (bool)(bVar2 >> 7);
    local_4d.tcc = bVar11;
    getSequenceStepTimeouts(this,&local_4d,&local_48);
    iVar5 = 0x8e8;
    if (bVar11 != false) {
      iVar5 = local_48.msrcDssTccMicroseconds + 0xb36;
    }
    if ((bVar2 >> 3 & 1) == 0) {
      if ((bVar2 >> 2 & 1) != 0) {
        iVar5 = iVar5 + local_48.msrcDssTccMicroseconds + 0x294;
      }
    }
    else {
      iVar5 = iVar5 + local_48.msrcDssTccMicroseconds * 2 + 0x564;
    }
    iVar9 = 0;
    if ((bVar3 & 1) != 0) {
      iVar9 = local_48.preRangeMicroseconds + 0x294;
    }
    uVar10 = iVar9 + iVar5 + 0x226;
    if (-1 < (char)bVar2) {
      uVar10 = iVar9 + iVar5;
    }
    bVar11 = uVar10 <= budgetMicroseconds;
    if (bVar11) {
      uVar6 = (uint)(byte)local_48.finalRangeVCSELPeriodPCLKs * 0x3a2f00 + 500;
      value = 0;
      uVar8 = 0;
      if ((bVar3 & 1) != 0) {
        uVar8 = local_48.preRangeMCLKs;
      }
      uVar7 = uVar8 + (short)((ulong)(uVar6 / 2000 + (budgetMicroseconds - uVar10) * 1000) /
                             ((ulong)uVar6 / 1000));
      if (uVar7 != 0) {
        uVar10 = uVar7 - 1;
        sVar4 = 0;
        if (0x100 < uVar7) {
          sVar4 = 0;
          uVar6 = uVar10;
          do {
            uVar10 = uVar6 >> 1;
            sVar4 = sVar4 + 0x100;
            bVar1 = 0x1ff < uVar6;
            uVar6 = uVar10;
          } while (bVar1);
        }
        value = (short)uVar10 + sVar4;
      }
      writeRegister16Bit(this,'q',value);
      *(uint32_t *)&(this->super_VL53LXX).field_0x6c = budgetMicroseconds;
    }
  }
  return bVar11;
}

Assistant:

bool VL53L0X::setMeasurementTimingBudget(uint32_t budgetMicroseconds) {
	// note that these are different than values in get_
	uint16_t const START_OVERHEAD = 1320;
	uint16_t const END_OVERHEAD = 960;
	uint16_t const MSRC_OVERHEAD = 660;
	uint16_t const TCC_OVERHEAD = 590;
	uint16_t const DSS_OVERHEAD = 690;
	uint16_t const PRE_RANGE_OVERHEAD = 660;
	uint16_t const FINAL_RANGE_OVERHEAD = 550;
	uint32_t const MIN_TIMING_BUDGET = 20000;

	if (budgetMicroseconds < MIN_TIMING_BUDGET) {
		return false;
	}

	VL53L0XSequenceStepEnables enables;
	VL53L0XSequenceStepTimeouts timeouts;
	this->getSequenceStepEnables(&enables);
	this->getSequenceStepTimeouts(&enables, &timeouts);

	uint32_t usedBudgetMicroseconds = START_OVERHEAD + END_OVERHEAD;
	if (enables.tcc) {
		usedBudgetMicroseconds += (timeouts.msrcDssTccMicroseconds + TCC_OVERHEAD);
	}
	if (enables.dss) {
		usedBudgetMicroseconds += 2 * (timeouts.msrcDssTccMicroseconds + DSS_OVERHEAD);
	} else if (enables.msrc) {
		usedBudgetMicroseconds += (timeouts.msrcDssTccMicroseconds + MSRC_OVERHEAD);
	}
	if (enables.preRange) {
		usedBudgetMicroseconds += (timeouts.preRangeMicroseconds + PRE_RANGE_OVERHEAD);
	}
	if (enables.finalRange) {
		usedBudgetMicroseconds += FINAL_RANGE_OVERHEAD;
	}

	// "Note that the final range timeout is determined by the timing
	// budget and the sum of all other timeouts within the sequence.
	// If there is no room for the final range timeout, then an error
	// will be set. Otherwise the remaining time will be applied to
	// the final range."

	if (usedBudgetMicroseconds > budgetMicroseconds) {
		// "Requested timeout too small."
		return false;
	}

	uint32_t finalRangeTimeoutMicroseconds = budgetMicroseconds - usedBudgetMicroseconds;

	// set_sequence_step_timeout() begin
	// (SequenceStepId == VL53L0X_SEQUENCESTEP_FINAL_RANGE)

	// "For the final range timeout, the pre-range timeout
	// must be added. To do this both final and pre-range
	// timeouts must be expressed in macro periods MClks
	// because they have different vcsel periods."

	uint16_t finalRangeTimeoutMCLKs = timeoutMicrosecondsToMclks(finalRangeTimeoutMicroseconds, timeouts.finalRangeVCSELPeriodPCLKs);

	if (enables.preRange) {
		finalRangeTimeoutMCLKs += timeouts.preRangeMCLKs;
	}

	this->writeRegister16Bit(FINAL_RANGE_CONFIG_TIMEOUT_MACROP_HI, encodeTimeout(finalRangeTimeoutMCLKs));

	// set_sequence_step_timeout() end

	// store for internal reuse
	this->measurementTimingBudgetMicroseconds = budgetMicroseconds;

	return true;
}